

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O0

void psh_hint_table_record_mask(PSH_Hint_Table table,PS_Mask hint_mask)

{
  uint uVar1;
  uint local_2c;
  FT_UInt limit;
  FT_UInt idx;
  FT_Byte *cursor;
  FT_Int val;
  FT_Int mask;
  PS_Mask hint_mask_local;
  PSH_Hint_Table table_local;
  
  cursor._4_4_ = 0;
  cursor._0_4_ = 0;
  _limit = hint_mask->bytes;
  uVar1 = hint_mask->num_bits;
  for (local_2c = 0; local_2c < uVar1; local_2c = local_2c + 1) {
    if (cursor._4_4_ == 0) {
      cursor._0_4_ = (uint)*_limit;
      cursor._4_4_ = 0x80;
      _limit = _limit + 1;
    }
    if (((uint)cursor & cursor._4_4_) != 0) {
      psh_hint_table_record(table,local_2c);
    }
    cursor._4_4_ = (int)cursor._4_4_ >> 1;
  }
  return;
}

Assistant:

static void
  psh_hint_table_record_mask( PSH_Hint_Table  table,
                              PS_Mask         hint_mask )
  {
    FT_Int    mask = 0, val = 0;
    FT_Byte*  cursor = hint_mask->bytes;
    FT_UInt   idx, limit;


    limit = hint_mask->num_bits;

    for ( idx = 0; idx < limit; idx++ )
    {
      if ( mask == 0 )
      {
        val  = *cursor++;
        mask = 0x80;
      }

      if ( val & mask )
        psh_hint_table_record( table, idx );

      mask >>= 1;
    }
  }